

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_load_standard_ports(sexp ctx,sexp env,FILE *in,FILE *out,FILE *err,int no_close)

{
  char cVar1;
  sexp p;
  sexp local_40;
  sexp_gc_var_t local_38;
  
  local_38.var = &local_40;
  local_40 = (sexp)&DAT_0000043e;
  local_38.next = (ctx->value).context.saves;
  (ctx->value).context.saves = &local_38;
  if (env == (sexp)0x0) {
    env = (ctx->value).type.cpl;
  }
  cVar1 = (char)no_close;
  if (in != (FILE *)0x0) {
    local_40 = sexp_make_input_port(ctx,in,(sexp)&DAT_0000003e);
    (local_40->value).flonum_bits[0x2c] = cVar1;
    sexp_set_parameter(ctx,env,(sexp)(((ctx->value).type.setters)->value).context.mark_stack[3].
                                     start,local_40);
  }
  if (out != (FILE *)0x0) {
    local_40 = sexp_make_output_port(ctx,out,(sexp)&DAT_0000003e);
    (local_40->value).flonum_bits[0x2c] = cVar1;
    sexp_set_parameter(ctx,env,(sexp)(((ctx->value).type.setters)->value).context.mark_stack[3].end,
                       local_40);
  }
  if (err != (FILE *)0x0) {
    local_40 = sexp_make_output_port(ctx,err,(sexp)&DAT_0000003e);
    (local_40->value).flonum_bits[0x2c] = cVar1;
    sexp_set_parameter(ctx,env,(sexp)(((ctx->value).type.setters)->value).context.mark_stack[3].prev
                       ,local_40);
  }
  (ctx->value).context.saves = local_38.next;
  return (sexp)&DAT_0000043e;
}

Assistant:

sexp sexp_load_standard_ports (sexp ctx, sexp env, FILE* in, FILE* out,
                               FILE* err, int no_close) {
  sexp_gc_var1(p);
  sexp_gc_preserve1(ctx, p);
  if (!env) env = sexp_context_env(ctx);
  if (in) {
    p = sexp_make_input_port(ctx, in, SEXP_FALSE);
    sexp_port_no_closep(p) = no_close;
    sexp_set_parameter(ctx, env, sexp_global(ctx, SEXP_G_CUR_IN_SYMBOL), p);
  }
  if (out) {
    p = sexp_make_output_port(ctx, out, SEXP_FALSE);
    sexp_port_no_closep(p) = no_close;
    sexp_set_parameter(ctx, env, sexp_global(ctx, SEXP_G_CUR_OUT_SYMBOL), p);
  }
  if (err) {
    p = sexp_make_output_port(ctx, err, SEXP_FALSE);
    sexp_port_no_closep(p) = no_close;
    sexp_set_parameter(ctx, env, sexp_global(ctx, SEXP_G_CUR_ERR_SYMBOL), p);
  }
  sexp_gc_release1(ctx);
  return SEXP_VOID;
}